

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

string * deqp::gles31::Functional::anon_unknown_1::getUniformName
                   (string *__return_storage_ptr__,string *name,int declNdx,int arrNdx)

{
  string local_d0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_20;
  int local_1c;
  int arrNdx_local;
  int declNdx_local;
  string *name_local;
  
  local_20 = arrNdx;
  local_1c = declNdx;
  _arrNdx_local = name;
  name_local = __return_storage_ptr__;
  de::toString<int>(&local_a0,&local_1c);
  std::operator+(&local_80,name,&local_a0);
  std::operator+(&local_60,&local_80,"[");
  de::toString<int>(&local_d0,&local_20);
  std::operator+(&local_40,&local_60,&local_d0);
  std::operator+(__return_storage_ptr__,&local_40,"]");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::string getUniformName (const std::string& name, int declNdx, int arrNdx)
{
	return name + de::toString(declNdx) + "[" + de::toString(arrNdx) + "]";
}